

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.cpp
# Opt level: O0

void __thiscall gui::ChatBox::draw(ChatBox *this,RenderTarget *target,RenderStates states)

{
  float fVar1;
  float X;
  BlendMode *pBVar2;
  bool bVar3;
  uint uVar4;
  element_type *peVar5;
  RenderStates *pRVar6;
  undefined1 *puVar7;
  unsigned_long *puVar8;
  size_type sVar9;
  reference pvVar10;
  Text *in_RSI;
  Widget *in_RDI;
  size_t i_1;
  size_t selectionMax;
  size_t selectionMin;
  size_t i;
  size_t lineCount;
  Vector2f lastPosition;
  float textHeight;
  undefined1 in_stack_000001ff;
  ChatBox *in_stack_00000200;
  Vector2f in_stack_fffffffffffffef8;
  Color *color;
  Text *in_stack_ffffffffffffff00;
  Color *in_stack_ffffffffffffff08;
  size_type sVar11;
  Text *in_stack_ffffffffffffff10;
  float local_74;
  size_type local_58;
  ulong local_50;
  ulong local_48;
  RenderStates *in_stack_ffffffffffffffd0;
  RenderStates *pRVar12;
  RenderStates *states_00;
  Drawable *in_stack_ffffffffffffffd8;
  Drawable *drawable;
  undefined4 in_stack_ffffffffffffffe0;
  float in_stack_ffffffffffffffe4;
  
  bVar3 = Widget::isVisible(in_RDI);
  if (bVar3) {
    Widget::getTransform((Widget *)0x2355a2);
    sf::operator*=((Transform *)in_stack_ffffffffffffff00,(Transform *)in_stack_fffffffffffffef8);
    updateVisibleLines(in_stack_00000200,(bool)in_stack_000001ff);
    if (((ulong)in_RDI[1].onFocusLost.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_parent & 1) == 0) {
      std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x2355ed);
      sf::RectangleShape::setSize
                ((RectangleShape *)in_stack_ffffffffffffff00,(Vector2f *)in_stack_fffffffffffffef8);
      std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x23562c);
      sf::RenderTarget::draw
                ((RenderTarget *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    }
    peVar5 = std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x235661);
    fVar1 = (peVar5->textPadding_).z;
    std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x235679);
    uVar4 = ChatBoxStyle::getCharacterSize((ChatBoxStyle *)0x235681);
    peVar5 = std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2356a5);
    X = (peVar5->textPadding_).x;
    peVar5 = std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2356c0);
    local_74 = (float)(*(long *)&in_RDI[1].onFocusLost.callbacks_._M_t._M_impl - 1);
    sf::Vector2<float>::Vector2
              ((Vector2<float> *)&stack0xffffffffffffffe4,X,
               fVar1 * (float)uVar4 * local_74 + (peVar5->textPadding_).y);
    drawable = (Drawable *)0x0;
    pRVar12 = (RenderStates *)0x0;
    while ((states_00 = pRVar12,
           pRVar6 = (RenderStates *)
                    std::
                    vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                    ::size((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                            *)(in_RDI[1].transformable_.m_transform.m_matrix + 7)), pRVar12 < pRVar6
           && ((((ulong)in_RDI[1].onFocusLost.callbacks_._M_t._M_impl.super__Rb_tree_header.
                        _M_header._M_parent & 1) == 0 ||
               (drawable !=
                *(Drawable **)(in_RDI[1].transformable_.m_inverseTransform.m_matrix + 0xe)))))) {
      std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x235803);
      anon_unknown.dwarf_2a6366::roundVector2f(in_stack_fffffffffffffef8);
      sf::Transformable::setPosition
                ((Transformable *)in_stack_ffffffffffffff00,(Vector2f *)in_stack_fffffffffffffef8);
      std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x23585b);
      std::
      vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
      ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                    *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),(size_type)states_00);
      sf::Text::setString(in_stack_ffffffffffffff00,(String *)in_stack_fffffffffffffef8);
      if (((ulong)in_RDI[1].onFocusLost.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent & 1) == 0) {
        std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2358b4);
        std::
        vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
        ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                      *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),(size_type)states_00);
        sf::Text::setFillColor(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
      else {
        std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x235905);
        std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x235924);
        sf::Text::setFillColor(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
        std::
        vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
        ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                      *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),(size_type)states_00);
        std::
        vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
        ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                      *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),(size_type)states_00);
        sf::Shape::setFillColor
                  ((Shape *)in_stack_ffffffffffffff00,(Color *)in_stack_fffffffffffffef8);
        std::
        vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
        ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                      *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),(size_type)states_00);
        sf::RenderTarget::draw
                  ((RenderTarget *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   drawable,states_00);
      }
      peVar5 = std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2359e0);
      pvVar10 = std::
                vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                              *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),
                             (size_type)states_00);
      sf::Text::setStyle(&peVar5->text_,(pvVar10->first).style);
      std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x235a35);
      sf::RenderTarget::draw
                ((RenderTarget *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 drawable,states_00);
      pBVar2 = &states_00->blendMode;
      puVar7 = (undefined1 *)
               std::
               vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
               ::size((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                       *)(in_RDI[1].transformable_.m_transform.m_matrix + 7));
      if ((byte *)((long)&pBVar2->colorSrcFactor + 1U) < puVar7) {
        pvVar10 = std::
                  vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                  ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),
                               (size_type)states_00);
        in_stack_ffffffffffffff10 = (Text *)(pvVar10->first).id;
        pvVar10 = std::
                  vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                  ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),
                               (size_type)((long)&(states_00->blendMode).colorSrcFactor + 1));
        if (in_stack_ffffffffffffff10 != (Text *)(pvVar10->first).id) {
          drawable = (Drawable *)((long)&drawable->_vptr_Drawable + 1);
        }
      }
      pRVar12 = (RenderStates *)((long)&(states_00->blendMode).colorSrcFactor + 1);
    }
    if ((((ulong)in_RDI[1].onFocusLost.callbacks_._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent & 1) == 0) && (bVar3 = Widget::isFocused(in_RDI), bVar3)) {
      local_48 = std::numeric_limits<unsigned_long>::max();
      local_50 = std::numeric_limits<unsigned_long>::max();
      if (((uint)in_RDI[1].transformable_.m_inverseTransform.m_matrix[2] & 1) != 0) {
        puVar8 = std::min<unsigned_long>
                           ((unsigned_long *)&in_RDI[1].transformable_.m_inverseTransform,
                            (unsigned_long *)
                            (in_RDI[1].transformable_.m_inverseTransform.m_matrix + 4));
        local_48 = *puVar8;
        puVar8 = std::max<unsigned_long>
                           ((unsigned_long *)&in_RDI[1].transformable_.m_inverseTransform,
                            (unsigned_long *)
                            (in_RDI[1].transformable_.m_inverseTransform.m_matrix + 4));
        local_50 = *puVar8;
      }
      local_58 = 0;
      while (sVar11 = local_58,
            sVar9 = std::
                    vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                    ::size((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                            *)(in_RDI[1].transformable_.m_transform.m_matrix + 7)), sVar11 < sVar9)
      {
        pvVar10 = std::
                  vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                  ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),local_58);
        if ((local_48 <= (pvVar10->first).id) &&
           (pvVar10 = std::
                      vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                      ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                    *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),local_58),
           (pvVar10->first).id <= local_50)) {
          pvVar10 = std::
                    vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                    ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                                  *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),local_58);
          color = (Color *)&pvVar10->second;
          std::__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gui::ChatBoxStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x235ca1);
          sf::Shape::setFillColor((Shape *)in_stack_ffffffffffffff00,color);
          in_stack_ffffffffffffff00 = in_RSI;
          std::
          vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
          ::operator[]((vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
                        *)(in_RDI[1].transformable_.m_transform.m_matrix + 7),local_58);
          sf::RenderTarget::draw
                    ((RenderTarget *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     drawable,states_00);
        }
        local_58 = local_58 + 1;
      }
    }
  }
  return;
}

Assistant:

void ChatBox::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    updateVisibleLines(true);

    if (!autoHide_) {
        style_->rect_.setSize(size_);
        target.draw(style_->rect_, states);
    }

    const float textHeight = style_->textPadding_.z * style_->getCharacterSize();
    sf::Vector2f lastPosition = {
        style_->textPadding_.x,
        style_->textPadding_.y + textHeight * (sizeCharacters_.y - 1)
    };
    size_t lineCount = 0;
    for (size_t i = 0; i < visibleLines_.size(); ++i) {
        if (autoHide_ && lineCount == hideCounter_) {
            break;
        }
        style_->text_.setPosition(roundVector2f(lastPosition));
        style_->text_.setString(visibleLines_[i].first.str);
        if (!autoHide_) {
            style_->text_.setFillColor(visibleLines_[i].first.color);
        } else {
            style_->text_.setFillColor(style_->invertedTextColor_);
            visibleLines_[i].second.setFillColor(visibleLines_[i].first.color);
            target.draw(visibleLines_[i].second, states);
        }
        style_->text_.setStyle(visibleLines_[i].first.style);
        target.draw(style_->text_, states);
        lastPosition.y -= textHeight;
        if (i + 1 < visibleLines_.size() && visibleLines_[i].first.id != visibleLines_[i + 1].first.id) {
            ++lineCount;
        }
    }

    if (!autoHide_ && isFocused()) {
        size_t selectionMin = std::numeric_limits<size_t>::max();
        size_t selectionMax = std::numeric_limits<size_t>::max();
        if (selectionStart_.second) {
            selectionMin = std::min(selectionStart_.first, selectionEnd_);
            selectionMax = std::max(selectionStart_.first, selectionEnd_);
        }

        for (size_t i = 0; i < visibleLines_.size(); ++i) {
            if (visibleLines_[i].first.id >= selectionMin && visibleLines_[i].first.id <= selectionMax) {
                visibleLines_[i].second.setFillColor(style_->highlightColor_);
                target.draw(visibleLines_[i].second, states);
            }
        }
    }
}